

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTPNStmTop * __thiscall CTcParser::parse_template_def(CTcParser *this,int *err,CTcToken *class_tok)

{
  int iVar1;
  tc_symtype_t tVar2;
  tc_metaclass_t tVar3;
  tc_toktyp_t tVar4;
  CTPNStmTop *pCVar5;
  CTcSymObjBase *pCVar6;
  CTcPrsSymtab *pCVar7;
  char *pcVar8;
  CTcToken *pCVar9;
  CTcSymPropBase *this_00;
  size_t sVar10;
  char *pcVar11;
  uint uVar12;
  CTcToken *in_RDX;
  CTcParser *in_RDI;
  CTcObjTemplateItem *sub;
  CTcObjTemplateItem *item_1;
  CTcSymProp *prop_sym;
  CTcObjTemplateItem *item;
  tc_toktyp_t kwtok;
  int valid;
  size_t rem;
  utf8_ptr p;
  int is_opt;
  int is_alt;
  int is_inh;
  int ok;
  tc_toktyp_t def_tok;
  int done;
  int all_ok;
  int found_inh;
  size_t item_cnt;
  CTcSymObj *class_sym;
  CTcObjTemplateItem *item_tail;
  CTcObjTemplateItem *item_head;
  CTcObjTemplateItem *alt_group_head;
  CTcToken prop_tok;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  CTcTokenizer *in_stack_fffffffffffffe70;
  CTcTokenizer *in_stack_fffffffffffffe78;
  CTcToken *in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  uint in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  CTcToken *in_stack_fffffffffffffe98;
  CTcParser *in_stack_fffffffffffffea0;
  tc_metaclass_t in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  CTcTokenizer **in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  tc_toktyp_t in_stack_fffffffffffffecc;
  CTcTokenizer *in_stack_fffffffffffffed0;
  bool local_121;
  int *in_stack_ffffffffffffff10;
  CTcParser *in_stack_ffffffffffffff18;
  CTcToken *local_d8;
  CTcToken *local_d0;
  CTcToken *local_c0;
  utf8_ptr local_a8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  tc_toktyp_t local_90;
  int local_8c;
  int local_88;
  int local_74;
  long local_70;
  CTcSymObjBase *local_68;
  CTcToken *local_60;
  CTcToken *local_58;
  CTcToken *local_50;
  CTcToken local_48;
  CTcToken *local_20;
  
  local_20 = in_RDX;
  CTcToken::CTcToken(&local_48);
  local_50 = (CTcToken *)0x0;
  local_60 = (CTcToken *)0x0;
  local_58 = (CTcToken *)0x0;
  local_70 = 0;
  local_74 = 0;
  if (local_20 == (CTcToken *)0x0) {
    local_68 = (CTcSymObjBase *)0x0;
  }
  else {
    iVar1 = CTcToken::text_matches(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    if (iVar1 != 0) {
      pCVar5 = parse_string_template_def(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      return pCVar5;
    }
    get_global_symtab(in_RDI);
    CTcToken::get_text(local_20);
    CTcToken::get_text_len(local_20);
    local_68 = (CTcSymObjBase *)
               CTcPrsSymtab::find_noref
                         ((CTcPrsSymtab *)
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          (textchar_t *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78,
                          (CTcPrsSymtab **)in_stack_fffffffffffffe70);
    if (local_68 == (CTcSymObjBase *)0x0) {
      pCVar6 = (CTcSymObjBase *)CTcSymbolBase::operator_new(0x21bb65);
      CTcToken::get_text(local_20);
      CTcToken::get_text_len(local_20);
      CTcGenTarg::new_obj_id(G_cg);
      in_stack_fffffffffffffe70 = (CTcTokenizer *)0x0;
      in_stack_fffffffffffffe68 = 0;
      CTcSymObj::CTcSymObj
                ((CTcSymObj *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98,
                 CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                 (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),in_stack_fffffffffffffeb0,
                 (CTcDictEntry *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      local_68 = pCVar6;
      pCVar7 = get_global_symtab(in_RDI);
      (*pCVar7->_vptr_CTcPrsSymtab[3])(pCVar7,local_68);
    }
    else {
      tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)local_68);
      if ((tVar2 != TC_SYM_OBJ) ||
         (tVar3 = CTcSymObjBase::get_metaclass(local_68), tVar3 != TC_META_TADSOBJ)) {
        CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        local_68 = (CTcSymObjBase *)0x0;
      }
    }
  }
  CTcTokenizer::next(in_stack_fffffffffffffe78);
  local_88 = 1;
  local_8c = 0;
  do {
    do {
      if (local_8c != 0) {
        if (local_70 == 0) {
          CTcTokenizer::log_error(0x2bc5);
          local_88 = 0;
        }
        if (local_88 != 0) {
          if (local_74 == 0) {
            add_template_def((CTcParser *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (CTcSymObj *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                             (CTcObjTemplateItem *)in_stack_fffffffffffffe80,
                             (size_t)in_stack_fffffffffffffe78);
          }
          else {
            add_inherited_templates
                      (in_stack_fffffffffffffea0,(CTcSymObj *)in_stack_fffffffffffffe98,
                       (CTcObjTemplateItem *)
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          }
        }
        return (CTPNStmTop *)0x0;
      }
      local_94 = 1;
      local_90 = CTcTokenizer::cur((CTcTokenizer *)0x21bcfc);
      local_98 = 0;
      tVar4 = CTcTokenizer::cur((CTcTokenizer *)0x21bd1d);
      switch(tVar4) {
      case TOKT_EOF:
      case TOKT_LBRACE:
      case TOKT_RBRACE:
      case TOKT_OBJECT:
        CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        local_8c = 1;
        local_94 = 0;
        break;
      default:
        CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        CTcTokenizer::next(in_stack_fffffffffffffe78);
        local_94 = 0;
        break;
      case TOKT_SSTR:
      case TOKT_DSTR:
        utf8_ptr::utf8_ptr(&local_a8);
        pCVar9 = CTcTokenizer::copycur
                           ((CTcTokenizer *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        memcpy(&local_48,pCVar9,0x21);
        local_90 = CTcTokenizer::cur((CTcTokenizer *)0x21bdc5);
        pCVar9 = CTcTokenizer::getcur(G_tok);
        pcVar11 = CTcToken::get_text(pCVar9);
        utf8_ptr::set(&local_a8,pcVar11);
        pCVar9 = CTcTokenizer::getcur(G_tok);
        sVar10 = CTcToken::get_text_len(pCVar9);
        local_121 = false;
        if (sVar10 != 0) {
          utf8_ptr::getch((utf8_ptr *)0x21be30);
          iVar1 = is_syminit(L'\0');
          local_121 = iVar1 != 0;
        }
        if (sVar10 != 0) {
          utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffe80,(size_t *)in_stack_fffffffffffffe78);
        }
        while (sVar10 != 0 && local_121) {
          utf8_ptr::getch((utf8_ptr *)0x21beaa);
          iVar1 = is_sym(L'\0');
          if (iVar1 == 0) {
            local_121 = false;
          }
          utf8_ptr::inc((utf8_ptr *)in_stack_fffffffffffffe80,(size_t *)in_stack_fffffffffffffe78);
        }
        if (local_121) {
          in_stack_fffffffffffffed0 = G_tok;
          CTcTokenizer::getcur(G_tok);
          iVar1 = CTcTokenizer::look_up_keyword
                            ((CTcTokenizer *)
                             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                             in_stack_fffffffffffffe80,(tc_toktyp_t *)in_stack_fffffffffffffe78);
          if (iVar1 != 0) {
            local_121 = false;
          }
        }
        if (!local_121) {
          CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
          local_94 = 0;
        }
        break;
      case TOKT_COMMA:
      case TOKT_PLUS:
      case TOKT_MINUS:
      case TOKT_TIMES:
      case TOKT_DIV:
      case TOKT_MOD:
      case TOKT_ARROW:
      case TOKT_AND:
      case TOKT_NOT:
      case TOKT_BNOT:
      case TOKT_AT:
        local_90 = CTcTokenizer::cur((CTcTokenizer *)0x21c0ac);
        tVar4 = CTcTokenizer::next(in_stack_fffffffffffffe78);
        if (tVar4 != TOKT_SYM) {
          in_stack_fffffffffffffea0 = (CTcParser *)CTcTokenizer::get_op_text(local_90);
          pCVar9 = CTcTokenizer::getcur(G_tok);
          sVar10 = CTcToken::get_text_len(pCVar9);
          pCVar9 = CTcTokenizer::getcur(G_tok);
          pcVar11 = CTcToken::get_text(pCVar9);
          CTcTokenizer::log_error(0x2b95,in_stack_fffffffffffffea0,sVar10 & 0xffffffff,pcVar11);
          local_94 = 0;
        }
        pCVar9 = CTcTokenizer::copycur
                           ((CTcTokenizer *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        memcpy(&local_48,pCVar9,0x21);
        break;
      case TOKT_LBRACK:
        local_90 = CTcTokenizer::cur((CTcTokenizer *)0x21bf64);
        tVar4 = CTcTokenizer::next(in_stack_fffffffffffffe78);
        if (tVar4 == TOKT_SYM) {
          pCVar9 = CTcTokenizer::copycur
                             ((CTcTokenizer *)
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          memcpy(&local_48,pCVar9,0x21);
          tVar4 = CTcTokenizer::next(in_stack_fffffffffffffe78);
          if (tVar4 != TOKT_RBRACK) {
            CTcTokenizer::log_error_curtok(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
          }
        }
        else {
          in_stack_fffffffffffffec0 = &G_tok;
          pcVar11 = CTcTokenizer::get_op_text(local_90);
          pCVar9 = CTcTokenizer::getcur(*in_stack_fffffffffffffec0);
          sVar10 = CTcToken::get_text_len(pCVar9);
          uVar12 = (uint)sVar10;
          pCVar9 = CTcTokenizer::getcur(*in_stack_fffffffffffffec0);
          pcVar8 = CTcToken::get_text(pCVar9);
          CTcTokenizer::log_error(0x2b95,pcVar11,(ulong)uVar12,pcVar8);
          local_94 = 0;
          in_stack_fffffffffffffecc = CTcTokenizer::cur((CTcTokenizer *)0x21c004);
          if ((((in_stack_fffffffffffffecc != TOKT_EOF) &&
               (1 < in_stack_fffffffffffffecc - TOKT_LBRACE)) &&
              (in_stack_fffffffffffffecc != TOKT_RBRACK)) && (in_stack_fffffffffffffecc != TOKT_SEM)
             ) {
            CTcTokenizer::next(in_stack_fffffffffffffe78);
          }
        }
        break;
      case TOKT_SEM:
        CTcTokenizer::next(in_stack_fffffffffffffe78);
        local_8c = 1;
        break;
      case TOKT_INHERITED:
        local_98 = 1;
        local_74 = 1;
      }
      local_a0 = 0;
      local_9c = 0;
      if (local_8c == 0) {
        CTcTokenizer::next(in_stack_fffffffffffffe78);
        tVar4 = CTcTokenizer::cur((CTcTokenizer *)0x21c1eb);
        if (tVar4 == TOKT_QUESTION) {
          local_a0 = 1;
          CTcTokenizer::next(in_stack_fffffffffffffe78);
        }
        tVar4 = CTcTokenizer::cur((CTcTokenizer *)0x21c219);
        if (tVar4 == TOKT_OR) {
          local_9c = 1;
          CTcTokenizer::next(in_stack_fffffffffffffe78);
        }
      }
      if ((local_60 != (CTcToken *)0x0) && ((local_60->int_val_ & 1) != 0)) {
        if (local_a0 != 0) {
          for (local_c0 = local_50; local_c0 != (CTcToken *)0x0;
              local_c0 = (CTcToken *)local_c0->text_len_) {
            *(byte *)&local_c0->int_val_ = (byte)local_c0->int_val_ & 0xfd | 2;
          }
        }
        if (((byte)local_60->int_val_ >> 1 & 1) != 0) {
          local_a0 = 1;
        }
      }
      if (local_94 == 0) {
        local_88 = 0;
      }
    } while ((local_8c != 0) || (local_94 == 0));
    local_d0 = (CTcToken *)0x0;
    if (local_98 == 0) {
      this_00 = &look_up_prop((CTcParser *)in_stack_fffffffffffffed0,
                              (CTcToken *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                              (int)((ulong)in_stack_fffffffffffffec0 >> 0x20))->super_CTcSymPropBase
      ;
      if (this_00 == (CTcSymPropBase *)0x0) {
        sVar10 = CTcToken::get_text_len(&local_48);
        in_stack_fffffffffffffe94 = (uint)sVar10;
        pcVar11 = CTcToken::get_text(&local_48);
        CTcTokenizer::log_error(0x2b99,(ulong)in_stack_fffffffffffffe94,pcVar11);
      }
      else {
        iVar1 = CTcSymPropBase::is_vocab(this_00);
        if (iVar1 == 0) {
          for (local_d0 = local_58; local_d0 != (CTcToken *)0x0;
              local_d0 = (CTcToken *)local_d0->text_len_) {
            if (*(CTcSymPropBase **)local_d0 == this_00) {
              local_d8 = local_d0;
              uVar12 = in_stack_fffffffffffffe8c;
              while( true ) {
                in_stack_fffffffffffffe8c = uVar12 & 0xffffff;
                if (local_d8 != (CTcToken *)0x0) {
                  in_stack_fffffffffffffe8c = CONCAT13((local_d8->int_val_ & 1) != 0,(int3)uVar12);
                }
                if ((char)(in_stack_fffffffffffffe8c >> 0x18) == '\0') break;
                local_d8 = (CTcToken *)local_d8->text_len_;
                uVar12 = in_stack_fffffffffffffe8c;
              }
              if (local_d8 != (CTcToken *)0x0) {
                sVar10 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x21c4b1);
                in_stack_fffffffffffffe88 = (uint)sVar10;
                pcVar11 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x21c4c2);
                CTcTokenizer::log_error(0x2b9c,(ulong)in_stack_fffffffffffffe88,pcVar11);
                break;
              }
            }
          }
          in_stack_fffffffffffffe80 =
               (CTcToken *)
               operator_new((size_t)in_stack_fffffffffffffe70,
                            (CTcPrsMem *)
                            CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
          CTcObjTemplateItem::CTcObjTemplateItem
                    ((CTcObjTemplateItem *)in_stack_fffffffffffffe80,(CTcSymProp *)this_00,local_90,
                     local_9c,local_a0);
          local_d0 = in_stack_fffffffffffffe80;
        }
        else {
          sVar10 = CTcSymbolBase::get_sym_len((CTcSymbolBase *)0x21c3db);
          in_stack_fffffffffffffe90 = (uint)sVar10;
          pcVar11 = CTcSymbolBase::get_sym((CTcSymbolBase *)0x21c3ec);
          CTcTokenizer::log_error(0x2b9b,(ulong)in_stack_fffffffffffffe90,pcVar11);
        }
      }
    }
    else {
      in_stack_fffffffffffffe98 =
           (CTcToken *)
           operator_new((size_t)in_stack_fffffffffffffe70,
                        (CTcPrsMem *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      CTcObjTemplateItem::CTcObjTemplateItem
                ((CTcObjTemplateItem *)in_stack_fffffffffffffe98,(CTcSymProp *)0x0,TOKT_INHERITED,0,
                 0);
      local_d0 = in_stack_fffffffffffffe98;
    }
    if (local_d0 != (CTcToken *)0x0) {
      if ((local_9c == 0) || ((local_60 != (CTcToken *)0x0 && ((local_60->int_val_ & 1) != 0)))) {
        if (local_9c == 0) {
          local_50 = (CTcToken *)0x0;
        }
      }
      else {
        local_50 = local_d0;
      }
      if (local_60 == (CTcToken *)0x0) {
        local_58 = local_d0;
      }
      else {
        local_60->text_len_ = (size_t)local_d0;
      }
      local_60 = local_d0;
      local_70 = local_70 + 1;
    }
  } while( true );
}

Assistant:

CTPNStmTop *CTcParser::parse_template_def(int *err, const CTcToken *class_tok)
{
    CTcToken prop_tok;
    CTcObjTemplateItem *alt_group_head;
    CTcObjTemplateItem *item_head;
    CTcObjTemplateItem *item_tail;
    CTcSymObj *class_sym;

    /* no items in our list yet */
    item_head = item_tail = alt_group_head = 0;
    size_t item_cnt = 0;

    /* presume we won't find an 'inherited' token */
    int found_inh = FALSE;

    /* 
     *   If there's a class token, it must refer to an object class.  If
     *   there's no such symbol defined yet, define it as an external
     *   object; otherwise, make sure the existing symbol is an object of
     *   metaclass tads-object.  
     */
    if (class_tok != 0)
    {
        /* 
         *   if the class token is 'string', it's a string template rather
         *   than an object template - go parse that separately if so 
         */
        if (class_tok->text_matches("string"))
            return parse_string_template_def(err);

        /* 
         *   Look up the symbol.  Don't mark the symbol as referenced; merely
         *   defining a template for an object doesn't require an external
         *   reference on the object.  
         */
        class_sym = (CTcSymObj *)get_global_symtab()->find_noref(
            class_tok->get_text(), class_tok->get_text_len(), 0);

        /* 
         *   if we didn't find it, define it; otherwise, ensure it's defined
         *   as an object 
         */
        if (class_sym == 0)
        {
            /* 
             *   it's undefined, so add a forward definition by creating the
             *   symbol as an external object 
             */
            class_sym = new CTcSymObj(class_tok->get_text(),
                                      class_tok->get_text_len(), FALSE,
                                      G_cg->new_obj_id(), TRUE,
                                      TC_META_TADSOBJ, 0);

            /* add it to the master symbol table */
            get_global_symtab()->add_entry(class_sym);
        }
        else if (class_sym->get_type() != TC_SYM_OBJ
                 || class_sym->get_metaclass() != TC_META_TADSOBJ)
        {
            /* it's defined incorrectly - flag the error */
            G_tok->log_error_curtok(TCERR_REDEF_AS_OBJ);

            /* forget the conflicting symbol and proceed with parsing */
            class_sym = 0;
        }
    }
    else
    {
        /* this is a root object template - there's no class symbol */
        class_sym = 0;
    }

    /* move on to the next token */
    G_tok->next();

    /* keep going until we run out of template tokens */
    int all_ok = TRUE;
    for (int done = FALSE ; !done ; )
    {
        tc_toktyp_t def_tok;
        int ok;
        int is_inh;
        int is_alt, is_opt;

        /* presume we will find a valid token */
        ok = TRUE;

        /* presume the defining token type is the current token */
        def_tok = G_tok->cur();

        /* presume this won't be an 'inherited' token */
        is_inh = FALSE;

        /* see what we have next */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* 
             *   that's the end of the statement - skip the semicolon, and
             *   we're done 
             */
            G_tok->next();
            done = TRUE;
            break;

        case TOKT_INHERITED:
            /* flag that we are to inherit superclass templates */
            is_inh = TRUE;
            found_inh = TRUE;
            break;

        case TOKT_SSTR:
        case TOKT_DSTR:
            /* string property */
            {
                utf8_ptr p;
                size_t rem;
                int valid;
                tc_toktyp_t kwtok;

                /* this is our property name token */
                prop_tok = *G_tok->copycur();

                /* 
                 *   this is also our defining token - the actual value in
                 *   object instances will use this string type 
                 */
                def_tok = G_tok->cur();
                
                /* 
                 *   make sure that the contents of the string forms a
                 *   valid symbol token 
                 */

                /* set up at the start of the token */
                p.set((char *)G_tok->getcur()->get_text());
                rem = G_tok->getcur()->get_text_len();

                /* make sure the first character is valid */
                valid = (rem != 0 && is_syminit(p.getch()));
                
                /* skip the first character */
                if (rem != 0)
                    p.inc(&rem);

                /* scan the rest of the string */
                for ( ; rem != 0 && valid ; p.inc(&rem))
                {
                    /* 
                     *   if this isn't a valid symbol character, we don't
                     *   have a valid symbol 
                     */
                    if (!is_sym(p.getch()))
                        valid = FALSE;
                }

                /* 
                 *   if the string is lexically valid as a symbol, make
                 *   sure it's not a keyword - if it is, it can't be a
                 *   property name 
                 */
                if (valid && G_tok->look_up_keyword(G_tok->getcur(), &kwtok))
                    valid = FALSE;

                /* if the symbol isn't valid, it's an error */
                if (!valid)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_OBJ_TPL_STR_REQ_PROP);

                    /* note the problem */
                    ok = FALSE;
                }
            }
            break;

        case TOKT_LBRACK:
            /* list property - defining instances will use lists here */
            def_tok = G_tok->cur();

            /* the next token must be the property name */
            if (G_tok->next() != TOKT_SYM)
            {
                /* log an error */
                G_tok->log_error(TCERR_OBJ_TPL_OP_REQ_PROP,
                                 G_tok->get_op_text(def_tok),
                                 (int)G_tok->getcur()->get_text_len(),
                                 G_tok->getcur()->get_text());

                /* note that we don't have a valid token */
                ok = FALSE;

                /* 
                 *   if this token isn't ']' or something that looks like
                 *   an end-of-statement token, skip it 
                 */
                switch(G_tok->cur())
                {
                case TOKT_SEM:
                case TOKT_EOF:
                case TOKT_LBRACE:
                case TOKT_RBRACE:
                    /* 
                     *   don't skip any of these - they might be statement
                     *   enders 
                     */
                    break;

                case TOKT_RBRACK:
                    /* 
                     *   they must simply have left out the property - don't
                     *   skip this, since we'll skip a token shortly anyway 
                     */
                    break;

                default:
                    /* skip the errant token */
                    G_tok->next();
                    break;
                }
            }
            else
            {
                /* remember the property token */
                prop_tok = *G_tok->copycur();

                /* require the ']' token */
                if (G_tok->next() != TOKT_RBRACK)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_OBJ_TPL_REQ_RBRACK);

                    /* 
                     *   proceed on the assumption that they simply left
                     *   out the ']' 
                     */
                }
            }
            break;

        case TOKT_AT:
        case TOKT_PLUS:
        case TOKT_MINUS:
        case TOKT_TIMES:
        case TOKT_DIV:
        case TOKT_MOD:
        case TOKT_ARROW:
        case TOKT_AND:
        case TOKT_NOT:
        case TOKT_BNOT:
        case TOKT_COMMA:
            /* the operator is the defining token */
            def_tok = G_tok->cur();

            /* the next token must be the property name */
            if (G_tok->next() != TOKT_SYM)
            {
                /* log an error */
                G_tok->log_error(TCERR_OBJ_TPL_OP_REQ_PROP,
                                 G_tok->get_op_text(def_tok),
                                 (int)G_tok->getcur()->get_text_len(),
                                 G_tok->getcur()->get_text());
                
                /* note that we don't have a valid token */
                ok = FALSE;
            }

            /* remember the property token */
            prop_tok = *G_tok->copycur();
            break;

        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_EOF:
        case TOKT_OBJECT:
            /* they must have left off the ';' */
            G_tok->log_error_curtok(TCERR_OBJ_TPL_BAD_TOK);

            /* 
             *   stop parsing here, assuming the statement should have
             *   ended by now 
             */
            done = TRUE;
            ok = FALSE;
            break;

        default:
            /* log an error and skip the invalid token */
            G_tok->log_error_curtok(TCERR_OBJ_TPL_BAD_TOK);
            G_tok->next();
            ok = FALSE;
            break;
        }

        /* presume we won't find an alternative or optionality suffix */
        is_opt = FALSE;
        is_alt = FALSE;

        /* 
         *   if we haven't reached the end of the statement, check to see if
         *   the item is optional or an alternative 
         */
        if (!done)
        {
            /* get the next token */
            G_tok->next();
            
            /* check to see if the item is optional */
            if (G_tok->cur() == TOKT_QUESTION)
            {
                /* it's optional */
                is_opt = TRUE;

                /* skip the '?' */
                G_tok->next();
            }

            /* check for an alternative */
            if (G_tok->cur() == TOKT_OR)
            {
                /* this item is an alternative */
                is_alt = TRUE;

                /* skip the '|' */
                G_tok->next();
            }
        }

        /* 
         *   If the previous item was followed by '|', we're in the same
         *   alternative group with that item.  This means we're optional if
         *   it's marked as optional, and all of the preceding items in our
         *   group are optional if we're marked as optional.  
         */
        if (item_tail != 0 && item_tail->is_alt_)
        {
            /* 
             *   if we're optional, mark all prior items in the group as
             *   optional 
             */
            if (is_opt)
            {
                CTcObjTemplateItem *item;

                /* mark everything in our group as optional */
                for (item = alt_group_head ; item != 0 ; item = item->nxt_)
                    item->is_opt_ = TRUE;
            }
            
            /* if the prior item was optional, we're optional */
            if (item_tail->is_opt_)
                is_opt = TRUE;
        }

        /* 
         *   if we encountered any problems, note that we have an error in
         *   the overall statement 
         */
        if (!ok)
            all_ok = FALSE;

        /* if we found a valid property token, add it to the template */
        if (!done && ok)
        {
            CTcSymProp *prop_sym;
            CTcObjTemplateItem *item;

            /* presume we won't create a new item */
            item = 0;

            /* check to see if it's a property or an 'inherited' token */
            if (is_inh)
            {
                /* create an 'inherited' template item */
                item = new (G_prsmem)
                       CTcObjTemplateItem(0, TOKT_INHERITED, FALSE, FALSE);
            }
            else
            {
                /* make sure we have a valid property name */
                prop_sym = look_up_prop(&prop_tok, FALSE);
                if (prop_sym == 0)
                {
                    /* couldn't find the property - log an error */
                    G_tok->log_error(TCERR_OBJ_TPL_SYM_NOT_PROP,
                                     (int)prop_tok.get_text_len(),
                                     prop_tok.get_text());
                }
                else if (prop_sym->is_vocab())
                {
                    /* dictionary properties are not valid in templates */
                    G_tok->log_error(TCERR_OBJ_TPL_NO_VOCAB,
                                     (int)prop_sym->get_sym_len(),
                                     prop_sym->get_sym());
                }
                else
                {
                    /* 
                     *   Scan the list so far to ensure that this same
                     *   property isn't already part of the list.  However,
                     *   do allow duplicates within the run of alternatives
                     *   of which the new item will be a part, since we'll
                     *   only end up using one of the alternatives and hence
                     *   the property will only be entered once in the
                     *   property even if it appears multiple times in the
                     *   run.  The run of alternatives of which we're a part
                     *   is the final run in the list, since we're being
                     *   added at the end of the list.  
                     */
                    for (item = item_head ; item != 0 ; item = item->nxt_)
                    {
                        /* check for a duplicate of this item's property */
                        if (item->prop_ == prop_sym)
                        {
                            CTcObjTemplateItem *sub;
                            
                            /* 
                             *   if everything from here to the end of the
                             *   list is marked as an alternative, then we're
                             *   just adding a duplicate property to a run of
                             *   alternatives, which is fine 
                             */
                            for (sub = item ; sub != 0 && sub->is_alt_ ;
                                 sub = sub->nxt_) ;

                            /* 
                             *   if we found a non-alternative following this
                             *   item, then this is indeed a duplicate; if we
                             *   didn't find any non-alternatives, we're just
                             *   adding this to a run of alternatives, so
                             *   we're okay 
                             */
                            if (sub != 0)
                            {
                                /* it's a duplicate - log the error */
                                G_tok->log_error(TCERR_OBJ_TPL_PROP_DUP,
                                    (int)prop_sym->get_sym_len(),
                                    prop_sym->get_sym());
                            
                                /* no need to look any further */
                                break;
                            }
                        }
                    }
                    
                    /* create the template item */
                    item = new (G_prsmem)
                           CTcObjTemplateItem(prop_sym, def_tok,
                                              is_alt, is_opt);
                }
            }
            
            /* if we have a valid new item, add it to our list */
            if (item != 0)
            {
                /* 
                 *   if we're an alternative and the prior item was not,
                 *   we're the head of a new alternative group; if we're not
                 *   an alternative, then we're not in an alternative group
                 *   after this item 
                 */
                if (is_alt && (item_tail == 0 || !item_tail->is_alt_))
                {
                    /* we're the head of a new group */
                    alt_group_head = item;
                }
                else if (!is_alt)
                {
                    /* we're no longer in an alternative group */
                    alt_group_head = 0;
                }

                /* link it into our list */
                if (item_tail != 0)
                    item_tail->nxt_ = item;
                else
                    item_head = item;
                item_tail = item;
            
                /* count it */
                ++item_cnt;
            }
        }
    }

    /* if the template is empty, warn about it */
    if (item_cnt == 0)
    {
        /* flag it as an error */
        G_tok->log_error(TCERR_TEMPLATE_EMPTY);

        /* there's no point in saving an empty template */
        all_ok = FALSE;
    }

    /* if we were successful, add the new template to our master list */
    if (all_ok)
    {
        /*
         *   If we found an 'inherited' keyword, we must expand the template
         *   with all inherited templates.  Otherwise, simply add the
         *   template exactly as given. 
         */
        if (found_inh)
        {
            /*
             *   Traverse all superclass templates and add each inherited
             *   form. 
             */
            add_inherited_templates(class_sym, item_head, item_cnt);
        }
        else
        {
            /* add our single template */
            add_template_def(class_sym, item_head, item_cnt);
        }
    }

    /* an 'object template' statement generates no tree data */
    return 0;
}